

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionParser.cpp
# Opt level: O2

unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
postfixExpression(Tokenizer *tokenizer)

{
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> uVar1;
  bool bVar2;
  Token *pTVar3;
  ExpressionFunctionHandler *this;
  Identifier *pIVar4;
  _List_node_base *p_Var5;
  Tokenizer *in_RSI;
  string_view other;
  optional<ExpressionFunctionHandle> oVar6;
  vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
  parameters;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp;
  
  pTVar3 = Tokenizer::peekToken(in_RSI,0);
  if ((pTVar3->type == Identifier) &&
     (pTVar3 = Tokenizer::peekToken(in_RSI,1), pTVar3->type == LParen)) {
    this = ExpressionFunctionHandler::instance();
    pTVar3 = Tokenizer::peekToken(in_RSI,0);
    pIVar4 = Token::identifierValue(pTVar3);
    oVar6 = ExpressionFunctionHandler::find(this,pIVar4);
    if (((undefined1  [16])
         oVar6.super__Optional_base<ExpressionFunctionHandle,_true,_true>._M_payload.
         super__Optional_payload_base<ExpressionFunctionHandle> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      pTVar3 = Tokenizer::nextToken(in_RSI);
      pIVar4 = Token::identifierValue(pTVar3);
      Tokenizer::eatToken(in_RSI);
      parameters.
      super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      parameters.
      super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      parameters.
      super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      while( true ) {
        pTVar3 = Tokenizer::peekToken(in_RSI,0);
        if (pTVar3->type == RParen) {
          Tokenizer::eatToken(in_RSI);
          std::
          make_unique<ExpressionInternal,Identifier_const&,std::vector<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::allocator<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>>>
                    ((Identifier *)tokenizer,
                     (vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                      *)pIVar4);
          goto LAB_0013e7b6;
        }
        if ((parameters.
             super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish !=
             parameters.
             super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start) &&
           (pTVar3 = Tokenizer::nextToken(in_RSI), pTVar3->type != Comma)) break;
        expression((Tokenizer *)&exp);
        uVar1 = exp;
        if ((__uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>)
            exp._M_t.
            super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>._M_t
            .super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
            super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>)0x0) {
          (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
          super__List_node_base._M_next = (_List_node_base *)0x0;
        }
        else {
          std::
          vector<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::allocator<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>>
          ::
          emplace_back<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
                    ((vector<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::allocator<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>>
                      *)&parameters,&exp);
        }
        std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                  (&exp);
        if ((__uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>)
            uVar1._M_t.
            super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>._M_t
            .super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
            super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>)0x0) {
LAB_0013e7b6:
          std::
          vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
          ::~vector(&parameters);
          return (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>)tokenizer
          ;
        }
      }
      (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
      super__List_node_base._M_next = (_List_node_base *)0x0;
      goto LAB_0013e7b6;
    }
  }
  pTVar3 = Tokenizer::peekToken(in_RSI,0);
  switch(pTVar3->type) {
  case Identifier:
    pIVar4 = Token::identifierValue(pTVar3);
    Tokenizer::eatToken(in_RSI);
    other._M_str = ".";
    other._M_len = 1;
    bVar2 = Identifier::operator==(pIVar4,other);
    if (bVar2) {
      parameters.
      super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(parameters.
                             super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,5);
      std::make_unique<ExpressionInternal,OperatorType>((OperatorType *)tokenizer);
    }
    else {
      std::make_unique<ExpressionInternal,Identifier_const&>((Identifier *)tokenizer);
    }
    break;
  case Integer:
    Tokenizer::eatToken(in_RSI);
    parameters.
    super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)Token::intValue(pTVar3);
    std::make_unique<ExpressionInternal,long>((long *)tokenizer);
    break;
  case String:
    Tokenizer::eatToken(in_RSI);
    Token::stringValue(pTVar3);
    std::make_unique<ExpressionInternal,StringLiteral_const&>((StringLiteral *)tokenizer);
    break;
  case Float:
    Tokenizer::eatToken(in_RSI);
    parameters.
    super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)Token::floatValue(pTVar3);
    std::make_unique<ExpressionInternal,double>((double *)tokenizer);
    break;
  case LParen:
    Tokenizer::eatToken(in_RSI);
    expression((Tokenizer *)&parameters);
    pTVar3 = Tokenizer::nextToken(in_RSI);
    p_Var5 = (_List_node_base *)
             parameters.
             super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pTVar3->type == RParen) {
      parameters.
      super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
    else {
      p_Var5 = (_List_node_base *)0x0;
    }
    (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var5;
    std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
              ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
               &parameters);
    break;
  default:
    (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)0x0;
  }
  return (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         tokenizer;
}

Assistant:

static std::unique_ptr<ExpressionInternal> postfixExpression(Tokenizer& tokenizer)
{
	if (tokenizer.peekToken(0).type == TokenType::Identifier &&
		tokenizer.peekToken(1).type == TokenType::LParen &&
		ExpressionFunctionHandler::instance().find(tokenizer.peekToken(0).identifierValue()))
	{
		const Identifier &functionName = tokenizer.nextToken().identifierValue();
		tokenizer.eatToken();

		std::vector<std::unique_ptr<ExpressionInternal>> parameters;
		while (tokenizer.peekToken().type != TokenType::RParen)
		{
			if (parameters.size() != 0 && tokenizer.nextToken().type != TokenType::Comma)
				return nullptr;

			std::unique_ptr<ExpressionInternal> exp = expression(tokenizer);
			if (exp == nullptr)
				return nullptr;

			parameters.push_back(std::move(exp));
		}

		tokenizer.eatToken();

		return std::make_unique<ExpressionInternal>(functionName, std::move(parameters));
	}

	return primaryExpression(tokenizer);
}